

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

time_t cimg_library::cimg::time(time_t *__timer)

{
  undefined1 local_18 [8];
  timeval st_time;
  
  gettimeofday((timeval *)local_18,(__timezone_ptr_t)0x0);
  return st_time.tv_sec / 1000 + (long)local_18 * 1000;
}

Assistant:

inline unsigned long time() {
#if cimg_OS==1
      struct timeval st_time;
      gettimeofday(&st_time,0);
      return (unsigned long)(st_time.tv_usec/1000 + st_time.tv_sec*1000);
#elif cimg_OS==2
      SYSTEMTIME st_time;
      GetLocalTime(&st_time);
      return (unsigned long)(st_time.wMilliseconds + 1000*(st_time.wSecond + 60*(st_time.wMinute + 60*st_time.wHour)));
#else
      return 0;
#endif
    }